

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

UniquePtr<SSL_SESSION> __thiscall
bssl::SSL_SESSION_dup(bssl *this,SSL_SESSION *session,int dup_flags)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  SSL_CIPHER *pSVar4;
  _func_bool_SSL_SESSION_ptr_SSL_SESSION_ptr *p_Var5;
  long lVar6;
  uint64_t uVar7;
  bool bVar8;
  pointer psVar9;
  pointer s;
  char *__p;
  pointer sk;
  _func_CRYPTO_BUFFER_ptr_CRYPTO_BUFFER_ptr *copy_func;
  stack_st_CRYPTO_BUFFER *__p_00;
  Span<const_unsigned_char> local_a0;
  Span<const_unsigned_char> local_90;
  Span<const_unsigned_char> local_80;
  Span<const_unsigned_char> local_70;
  Span<const_unsigned_char> local_60;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_50;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_48;
  __0 local_3d [8];
  anon_class_1_0_00000001 buf_up_ref;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_28;
  UniquePtr<SSL_SESSION> new_session;
  int dup_flags_local;
  SSL_SESSION *session_local;
  
  new_session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ = dup_flags;
  ssl_session_new((bssl *)&local_28,session->x509_method);
  bVar8 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (!bVar8) {
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    goto LAB_001b53de;
  }
  bVar1 = session->field_0x1b8;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->field_0x1b8 = psVar9->field_0x1b8 & 0xef | bVar1 & 0x10;
  uVar2 = session->ssl_version;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->ssl_version = uVar2;
  bVar1 = session->field_0x1b8;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->field_0x1b8 = psVar9->field_0x1b8 & 0xdf | bVar1 & 0x20;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  InplaceVector<unsigned_char,_32UL>::operator=(&psVar9->sid_ctx,&session->sid_ctx);
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  InplaceVector<unsigned_char,_64UL>::operator=(&psVar9->secret,&session->secret);
  pSVar4 = session->cipher;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->cipher = pSVar4;
  bVar8 = std::operator!=(&session->psk_identity,(nullptr_t)0x0);
  if (bVar8) {
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    s = std::unique_ptr<char,_bssl::internal::Deleter>::get(&session->psk_identity);
    __p = OPENSSL_strdup(s);
    std::unique_ptr<char,_bssl::internal::Deleter>::reset(&psVar9->psk_identity,__p);
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    bVar8 = std::operator==(&psVar9->psk_identity,(nullptr_t)0x0);
    if (bVar8) {
      std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
      goto LAB_001b53de;
    }
  }
  bVar8 = std::operator!=(&session->certs,(nullptr_t)0x0);
  if (bVar8) {
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    sk = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&session->certs);
    copy_func = SSL_SESSION_dup(ssl_session_st*,int)::$_0::operator_cast_to_function_pointer
                          (local_3d);
    __p_00 = sk_CRYPTO_BUFFER_deep_copy(sk,copy_func,CRYPTO_BUFFER_free);
    std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset(&psVar9->certs,__p_00);
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    bVar8 = std::operator==(&psVar9->certs,(nullptr_t)0x0);
    if (bVar8) {
      std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
      goto LAB_001b53de;
    }
  }
  p_Var5 = session->x509_method->session_dup;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_28);
  bVar8 = (*p_Var5)(psVar9,session);
  if (!bVar8) {
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    goto LAB_001b53de;
  }
  lVar6 = session->verify_result;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->verify_result = lVar6;
  UpRef((bssl *)&local_48,&session->ocsp_response);
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::operator=
            (&psVar9->ocsp_response,&local_48);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
  UpRef((bssl *)&local_50,&session->signed_cert_timestamp_list);
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::operator=
            (&psVar9->signed_cert_timestamp_list,&local_50);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  ::OPENSSL_memcpy(psVar9->peer_sha256,session->peer_sha256,0x20);
  bVar1 = session->field_0x1b8;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->field_0x1b8 = psVar9->field_0x1b8 & 0xfd | (bVar1 >> 1 & 1) << 1;
  uVar2 = session->peer_signature_algorithm;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->peer_signature_algorithm = uVar2;
  uVar3 = session->timeout;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->timeout = uVar3;
  uVar3 = session->auth_timeout;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->auth_timeout = uVar3;
  uVar7 = session->time;
  psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
  psVar9->time = uVar7;
  if ((new_session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ & 2) == 0) {
LAB_001b532b:
    if ((new_session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ & 1) != 0) {
      psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_a0,&session->ticket);
      bVar8 = Array<unsigned_char>::CopyFrom(&psVar9->ticket,local_a0);
      if (!bVar8) {
        std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
        goto LAB_001b53de;
      }
    }
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    psVar9->field_0x1b8 = psVar9->field_0x1b8 & 0xfb | 4;
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)this,&local_28);
  }
  else {
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    InplaceVector<unsigned_char,_32UL>::operator=(&psVar9->session_id,&session->session_id);
    uVar2 = session->group_id;
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    psVar9->group_id = uVar2;
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    InplaceVector<unsigned_char,_64UL>::operator=
              (&psVar9->original_handshake_hash,&session->original_handshake_hash);
    uVar3 = session->ticket_lifetime_hint;
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    psVar9->ticket_lifetime_hint = uVar3;
    uVar3 = session->ticket_age_add;
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    psVar9->ticket_age_add = uVar3;
    uVar3 = session->ticket_max_early_data;
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    psVar9->ticket_max_early_data = uVar3;
    bVar1 = session->field_0x1b8;
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    psVar9->field_0x1b8 = psVar9->field_0x1b8 & 0xfe | bVar1 & 1;
    bVar1 = session->field_0x1b8;
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    psVar9->field_0x1b8 = psVar9->field_0x1b8 & 0xbf | bVar1 & 0x40;
    psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_60,&session->early_alpn);
    bVar8 = Array<unsigned_char>::CopyFrom(&psVar9->early_alpn,local_60);
    if (bVar8) {
      psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_70,&session->quic_early_data_context);
      bVar8 = Array<unsigned_char>::CopyFrom(&psVar9->quic_early_data_context,local_70);
      if (bVar8) {
        psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_80,&session->local_application_settings);
        bVar8 = Array<unsigned_char>::CopyFrom(&psVar9->local_application_settings,local_80);
        if (bVar8) {
          psVar9 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
          Span<unsigned_char_const>::
          Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                    ((Span<unsigned_char_const> *)&local_90,&session->peer_application_settings);
          bVar8 = Array<unsigned_char>::CopyFrom(&psVar9->peer_application_settings,local_90);
          if (bVar8) goto LAB_001b532b;
        }
      }
    }
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
LAB_001b53de:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_SESSION> SSL_SESSION_dup(SSL_SESSION *session, int dup_flags) {
  UniquePtr<SSL_SESSION> new_session = ssl_session_new(session->x509_method);
  if (!new_session) {
    return nullptr;
  }

  new_session->is_server = session->is_server;
  new_session->ssl_version = session->ssl_version;
  new_session->is_quic = session->is_quic;
  new_session->sid_ctx = session->sid_ctx;

  // Copy the key material.
  new_session->secret = session->secret;
  new_session->cipher = session->cipher;

  // Copy authentication state.
  if (session->psk_identity != nullptr) {
    new_session->psk_identity.reset(
        OPENSSL_strdup(session->psk_identity.get()));
    if (new_session->psk_identity == nullptr) {
      return nullptr;
    }
  }
  if (session->certs != nullptr) {
    auto buf_up_ref = [](const CRYPTO_BUFFER *buf) {
      CRYPTO_BUFFER_up_ref(const_cast<CRYPTO_BUFFER *>(buf));
      return const_cast<CRYPTO_BUFFER *>(buf);
    };
    new_session->certs.reset(sk_CRYPTO_BUFFER_deep_copy(
        session->certs.get(), buf_up_ref, CRYPTO_BUFFER_free));
    if (new_session->certs == nullptr) {
      return nullptr;
    }
  }

  if (!session->x509_method->session_dup(new_session.get(), session)) {
    return nullptr;
  }

  new_session->verify_result = session->verify_result;

  new_session->ocsp_response = UpRef(session->ocsp_response);
  new_session->signed_cert_timestamp_list =
      UpRef(session->signed_cert_timestamp_list);

  OPENSSL_memcpy(new_session->peer_sha256, session->peer_sha256,
                 SHA256_DIGEST_LENGTH);
  new_session->peer_sha256_valid = session->peer_sha256_valid;

  new_session->peer_signature_algorithm = session->peer_signature_algorithm;

  new_session->timeout = session->timeout;
  new_session->auth_timeout = session->auth_timeout;
  new_session->time = session->time;

  // Copy non-authentication connection properties.
  if (dup_flags & SSL_SESSION_INCLUDE_NONAUTH) {
    new_session->session_id = session->session_id;
    new_session->group_id = session->group_id;
    new_session->original_handshake_hash = session->original_handshake_hash;
    new_session->ticket_lifetime_hint = session->ticket_lifetime_hint;
    new_session->ticket_age_add = session->ticket_age_add;
    new_session->ticket_max_early_data = session->ticket_max_early_data;
    new_session->extended_master_secret = session->extended_master_secret;
    new_session->has_application_settings = session->has_application_settings;

    if (!new_session->early_alpn.CopyFrom(session->early_alpn) ||
        !new_session->quic_early_data_context.CopyFrom(
            session->quic_early_data_context) ||
        !new_session->local_application_settings.CopyFrom(
            session->local_application_settings) ||
        !new_session->peer_application_settings.CopyFrom(
            session->peer_application_settings)) {
      return nullptr;
    }
  }

  // Copy the ticket.
  if (dup_flags & SSL_SESSION_INCLUDE_TICKET &&
      !new_session->ticket.CopyFrom(session->ticket)) {
    return nullptr;
  }

  // The new_session does not get a copy of the ex_data.

  new_session->not_resumable = true;
  return new_session;
}